

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::MaybeCrossFileRef_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          FileDescriptor *from_file,Descriptor *to_message)

{
  long lVar1;
  undefined8 *puVar2;
  string *psVar3;
  long *plVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  long *plVar5;
  size_type *psVar6;
  Descriptor *descriptor;
  undefined8 uVar7;
  ulong uVar8;
  long *local_a0;
  undefined8 local_98;
  long local_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  if ((*(int *)(this + 0x44) != 1) || (*(GeneratorOptions **)(from_file + 0x10) == options)) {
    psVar3 = GetMessagePath_abi_cxx11_
                       (__return_storage_ptr__,*(_anonymous_namespace_ **)(this + 0x20),
                        *(GeneratorOptions **)(this + 0x28),(Descriptor *)from_file);
    return psVar3;
  }
  anon_unknown_0::ModuleAlias
            ((string *)&local_60,
             (string *)((*(GeneratorOptions **)(from_file + 0x10))->output_dir)._M_dataplus._M_p);
  GetNestedMessageName_abi_cxx11_
            ((string *)local_80,*(_anonymous_namespace_ **)(from_file + 0x18),descriptor);
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_allocated_capacity != &local_50) {
    uVar7 = local_50._M_allocated_capacity;
  }
  if ((ulong)uVar7 < (ulong)(local_80._8_8_ + local_60._8_8_)) {
    uVar8 = 0xf;
    if ((string *)local_80._0_8_ != (string *)(local_80 + 0x10)) {
      uVar8 = local_80._16_8_;
    }
    if ((ulong)(local_80._8_8_ + local_60._8_8_) <= uVar8) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)local_80,0,(char *)0x0,local_60._M_allocated_capacity);
      goto LAB_0022af9a;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append(local_60._M_local_buf,local_80._0_8_);
LAB_0022af9a:
  local_a0 = &local_90;
  plVar4 = puVar2 + 2;
  if ((long *)*puVar2 == plVar4) {
    local_90 = *plVar4;
    uStack_88 = puVar2[3];
  }
  else {
    local_90 = *plVar4;
    local_a0 = (long *)*puVar2;
  }
  local_98 = puVar2[1];
  *puVar2 = plVar4;
  puVar2[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a0);
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    local_30 = *plVar5;
    lStack_28 = plVar4[3];
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar5;
    local_40 = (long *)*plVar4;
  }
  local_38 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)&local_40,**(ulong **)from_file);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar6) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  psVar3 = (string *)(local_80 + 0x10);
  if ((string *)local_80._0_8_ != psVar3) {
    operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    psVar3 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_allocated_capacity != &local_50) {
    operator_delete((void *)local_60._M_allocated_capacity,local_50._M_allocated_capacity + 1);
    psVar3 = extraout_RAX_00;
  }
  return psVar3;
}

Assistant:

string MaybeCrossFileRef(const GeneratorOptions& options,
                         const FileDescriptor* from_file,
                         const Descriptor* to_message) {
  if (options.import_style == GeneratorOptions::kImportCommonJs &&
      from_file != to_message->file()) {
    // Cross-file ref in CommonJS needs to use the module alias instead of
    // the global name.
    return ModuleAlias(to_message->file()->name()) +
           GetNestedMessageName(to_message->containing_type()) + "." +
           to_message->name();
  } else {
    // Within a single file we use a full name.
    return GetMessagePath(options, to_message);
  }
}